

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.cpp
# Opt level: O0

void __thiscall SGParser::Generator::NFA::TraverseGraph(NFA *this,NFANode *seed,NodeSet *visited)

{
  bool bVar1;
  _Base_ptr *this_00;
  reference ppNVar2;
  _Self local_60;
  _Self local_58;
  NFANode *local_50;
  NFANode *node;
  iterator __end2;
  iterator __begin2;
  vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_> *__range2;
  NodeSet *visited_local;
  NFANode *seed_local;
  NFA *this_local;
  
  visited_local = (NodeSet *)seed;
  seed_local = (NFANode *)this;
  std::
  set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
  ::insert(visited,(value_type *)&visited_local);
  this_00 = &(visited_local->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
  __end2 = std::
           vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
           begin((vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                  *)this_00);
  node = (NFANode *)
         std::
         vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>::
         end((vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
              *)this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
                                     *)&node), bVar1) {
    ppNVar2 = __gnu_cxx::
              __normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
              ::operator*(&__end2);
    local_50 = *ppNVar2;
    local_58._M_node =
         (_Base_ptr)
         std::
         set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
         ::find(visited,&local_50);
    local_60._M_node =
         (_Base_ptr)
         std::
         set<SGParser::Generator::NFANode_*,_std::less<SGParser::Generator::NFANode_*>,_std::allocator<SGParser::Generator::NFANode_*>_>
         ::end(visited);
    bVar1 = std::operator==(&local_58,&local_60);
    if (bVar1) {
      TraverseGraph(this,local_50,visited);
    }
    __gnu_cxx::
    __normal_iterator<SGParser::Generator::NFANode_**,_std::vector<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void NFA::TraverseGraph(NFANode* seed, NodeSet& visited) const {
    // Insert node if it's not already there
    visited.insert(seed);

    for (const auto node : seed->LinkPtr) {
        // If the node is not already inserted
        if (visited.find(node) == visited.end()) {
            // Traverse the rest of the graph (traversing will also insert the node)
            TraverseGraph(node, visited);
        }
    }
}